

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

apx_socketServer_t * apx_socketServer_new(apx_server_tag *apx_server)

{
  apx_socketServer_t *self_00;
  apx_socketServer_t *self;
  apx_server_tag *apx_server_local;
  
  self_00 = (apx_socketServer_t *)malloc(0x210);
  if (self_00 != (apx_socketServer_t *)0x0) {
    apx_socketServer_create(self_00,apx_server);
  }
  return self_00;
}

Assistant:

apx_socketServer_t* apx_socketServer_new(struct apx_server_tag *apx_server)
{
   apx_socketServer_t *self = (apx_socketServer_t*) malloc(sizeof(apx_socketServer_t));
   if (self != 0)
   {
      apx_socketServer_create(self, apx_server);
   }
   return self;
}